

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::TimingCheckArgSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != EmptyTimingCheckArg) && (kind != ExpressionTimingCheckArg)) &&
     (kind != TimingCheckEventArg)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TimingCheckArgSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyTimingCheckArg:
        case SyntaxKind::ExpressionTimingCheckArg:
        case SyntaxKind::TimingCheckEventArg:
            return true;
        default:
            return false;
    }
}